

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int Gia_ManCheckTopoOrder_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  
  if (pObj->Value == 0) {
    return 1;
  }
  pObj->Value = 0;
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (uVar1 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar1 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0xd7,"int Gia_ManCheckTopoOrder_rec(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar2 = Gia_ManCheckTopoOrder_rec(p,pObj + -(ulong)uVar1);
  if (iVar2 == 0) {
    return 0;
  }
  iVar2 = Gia_ManCheckTopoOrder_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
  if (iVar2 == 0) {
    return 0;
  }
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    pGVar3 = p->pObjs;
    if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar4 = (ulong)(uint)p->pReprs[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555] &
            0xfffffff;
    if (uVar4 != 0xfffffff) {
      if (p->nObjs <= (int)uVar4) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = pGVar3 + uVar4;
      goto LAB_001fd010;
    }
  }
  pGVar3 = (Gia_Obj_t *)0x0;
LAB_001fd010:
  uVar1 = 1;
  if (pGVar3 != (Gia_Obj_t *)0x0) {
    uVar1 = (uint)(pGVar3->Value == 0);
  }
  return uVar1;
}

Assistant:

int Gia_ManCheckTopoOrder_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pRepr;
    if ( pObj->Value == 0 )
        return 1;
    pObj->Value = 0;
    assert( Gia_ObjIsAnd(pObj) );
    if ( !Gia_ManCheckTopoOrder_rec( p, Gia_ObjFanin0(pObj) ) )
        return 0;
    if ( !Gia_ManCheckTopoOrder_rec( p, Gia_ObjFanin1(pObj) ) )
        return 0;
    pRepr = p->pReprs ? Gia_ObjReprObj( p, Gia_ObjId(p,pObj) ) : NULL;
    return pRepr == NULL || pRepr->Value == 0;
}